

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

uint64 ReadFileToMemory(string *filename,char **buf)

{
  byte bVar1;
  ulong uVar2;
  FILE *__stream;
  uint64 __n;
  string *file_00;
  ostream *poVar3;
  ostream *poVar4;
  undefined8 *in_RSI;
  uint64 read_size;
  bad_alloc *anon_var_0;
  uint64 len;
  FILE *file;
  Logger *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  LogSeverity severity;
  allocator local_141;
  string local_140 [32];
  FILE *in_stack_fffffffffffffee0;
  string local_118 [36];
  Logger local_f4;
  size_t local_f0;
  FILE *in_stack_ffffffffffffff50;
  allocator local_71;
  string local_70 [8];
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  undefined8 *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"ReadFileToMemory",&local_71);
    poVar3 = Logger::Start(severity,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                           in_stack_fffffffffffffe48);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf6);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"!filename.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar1 = std::__cxx11::string::empty();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar1 ^ 1));
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffde0);
    abort();
  }
  std::__cxx11::string::c_str();
  __stream = (FILE *)OpenFileOrDie(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __n = GetFileSize(in_stack_ffffffffffffff50);
  file_00 = (string *)operator_new__(__n);
  *local_10 = file_00;
  local_f0 = fread((void *)*local_10,1,__n,__stream);
  if (local_f0 != __n) {
    Logger::Logger(&local_f4,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,(allocator *)&stack0xfffffffffffffee7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"ReadFileToMemory",&local_141);
    poVar3 = Logger::Start(severity,file_00,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x103);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"read_size");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar4 = std::operator<<(poVar3,"len");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,__n);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  Close(in_stack_fffffffffffffee0);
  return __n;
}

Assistant:

inline uint64 ReadFileToMemory(const std::string &filename, char **buf) {
  CHECK(!filename.empty());
#ifndef _MSC_VER
  FILE *file = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE *file = OpenFileOrDie(filename.c_str(), "rb");
#endif
  uint64 len = GetFileSize(file);
  try {
    *buf = new char[len];
  } catch (std::bad_alloc &) {
    LOG(FATAL) << "Cannot allocate enough memory for Reader.";
  }
  uint64 read_size = fread(*buf, 1, len, file);
  CHECK_EQ(read_size, len);
  Close(file);
  return len;
}